

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformer.cpp
# Opt level: O3

unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_> __thiscall
verilogAST::Transformer::visit
          (Transformer *this,
          unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_> *node)

{
  long *plVar1;
  _Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>_>
  _Var2;
  long *in_RDX;
  anon_class_8_1_a78179b7 local_50;
  _Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>_>
  local_48;
  byte local_40;
  long *local_38;
  _Move_ctor_base<false,_std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>_>
  local_30;
  
  local_30.
  super__Copy_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Attribute>,_std::unique_ptr<verilogAST::Slice>,_std::unique_ptr<verilogAST::Index>_>
  .
  super__Variant_storage_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Attribute>,_std::unique_ptr<verilogAST::Slice>,_std::unique_ptr<verilogAST::Index>_>
  ._M_index = *(byte *)(*in_RDX + 0x10);
  local_50.__lhs = &local_30;
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>_>_&&>
    ::_S_vtable._M_arr
    [local_30.
     super__Copy_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Attribute>,_std::unique_ptr<verilogAST::Slice>,_std::unique_ptr<verilogAST::Index>_>
     .
     super__Variant_storage_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Attribute>,_std::unique_ptr<verilogAST::Slice>,_std::unique_ptr<verilogAST::Index>_>
     ._M_index]._M_data)
            (&local_50,
             (variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>_>
              *)(*in_RDX + 8));
  local_50.__lhs =
       (_Move_ctor_base<false,_std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>_>
        *)node;
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__deduce_visit_result<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/leonardt[P]verilogAST-cpp/include/verilogAST/transformer.hpp:13:9)_&&,_std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>_>_&>
    ::_S_vtable._M_arr
    [local_30.
     super__Copy_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Attribute>,_std::unique_ptr<verilogAST::Slice>,_std::unique_ptr<verilogAST::Index>_>
     .
     super__Variant_storage_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Attribute>,_std::unique_ptr<verilogAST::Slice>,_std::unique_ptr<verilogAST::Index>_>
     ._M_index]._M_data)
            ((variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>_>
              *)&local_48._M_first,(anon_class_8_1_8991fb9c_conflict4 *)&local_50,
             (variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>_>
              *)&local_30);
  local_50.__lhs =
       (_Move_ctor_base<false,_std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>_>
        *)(*in_RDX + 8);
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>_>_&>
    ::_S_vtable._M_arr[local_40]._M_data)
            ((anon_class_8_1_8991fb9c_conflict *)&local_50,
             (variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>_>
              *)&local_48._M_first);
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>_>_&>
    ::_S_vtable._M_arr[local_40]._M_data)
            ((anon_class_1_0_00000001 *)&local_50,
             (variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>_>
              *)&local_48._M_first);
  local_40 = 0xff;
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>_>_&>
    ::_S_vtable._M_arr
    [local_30.
     super__Copy_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Attribute>,_std::unique_ptr<verilogAST::Slice>,_std::unique_ptr<verilogAST::Index>_>
     .
     super__Variant_storage_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Attribute>,_std::unique_ptr<verilogAST::Slice>,_std::unique_ptr<verilogAST::Index>_>
     ._M_index]._M_data)
            ((anon_class_1_0_00000001 *)&local_50,
             (variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>_>
              *)&local_30);
  local_30.
  super__Copy_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Attribute>,_std::unique_ptr<verilogAST::Slice>,_std::unique_ptr<verilogAST::Index>_>
  .
  super__Variant_storage_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Attribute>,_std::unique_ptr<verilogAST::Slice>,_std::unique_ptr<verilogAST::Index>_>
  ._M_index = 0xff;
  local_38 = *(long **)(*in_RDX + 0x18);
  *(undefined8 *)(*in_RDX + 0x18) = 0;
  (*(code *)(((node->_M_t).
              super___uniq_ptr_impl<verilogAST::Index,_std::default_delete<verilogAST::Index>_>._M_t
              .super__Tuple_impl<0UL,_verilogAST::Index_*,_std::default_delete<verilogAST::Index>_>.
              super__Head_base<0UL,_verilogAST::Index_*,_false>._M_head_impl)->super_Expression).
            super_Node)(&local_48,node);
  _Var2 = local_48;
  local_48 = (_Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>_>
              )0x0;
  plVar1 = *(long **)(*in_RDX + 0x18);
  *(_Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>_>
    *)(*in_RDX + 0x18) = _Var2;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 0x10))();
    if (local_48 !=
        (_Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>_>
         )0x0) {
      (**(code **)(*(long *)local_48 + 0x10))();
    }
  }
  local_48 = (_Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>_>
              )0x0;
  if (local_38 != (long *)0x0) {
    (**(code **)(*local_38 + 0x10))();
  }
  this->_vptr_Transformer = (_func_int **)*in_RDX;
  *in_RDX = 0;
  return (__uniq_ptr_data<verilogAST::Index,_std::default_delete<verilogAST::Index>,_true,_true>)
         (__uniq_ptr_data<verilogAST::Index,_std::default_delete<verilogAST::Index>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<Index> Transformer::visit(std::unique_ptr<Index> node) {
  node->value = this->visit(std::move(node->value));
  node->index = this->visit(std::move(node->index));
  return node;
}